

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O2

bool __thiscall
sliding_puzzle::SlidingPuzzle::generateSolvableStartState(SlidingPuzzle *this,int soln_lower_bound)

{
  element_type *peVar1;
  long lVar2;
  long lVar3;
  pointer pvVar4;
  int iVar5;
  ostream *poVar6;
  ulong unaff_RBX;
  ulong uVar7;
  SlidingPuzzle *this_00;
  int k;
  ulong uVar8;
  int i;
  int iVar9;
  ulong unaff_R13;
  bool bVar10;
  int local_60;
  undefined4 local_5c;
  SlidingPuzzleStatePtr rand_state;
  SlidingPuzzleStatePtr new_state;
  
  peVar1 = (this->goal_).
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  lVar2 = (long)(peVar1->state_).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  for (uVar7 = 0;
      uVar7 != ((long)(peVar1->state_).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - lVar2) / 0x18; uVar7 = uVar7 + 1)
  {
    lVar3 = *(long *)(lVar2 + uVar7 * 0x18);
    for (uVar8 = 0; *(long *)(lVar2 + 8 + uVar7 * 0x18) - lVar3 >> 2 != uVar8; uVar8 = uVar8 + 1) {
      bVar10 = *(int *)(lVar3 + uVar8 * 4) == puzzle_anchor;
      if (bVar10) {
        unaff_R13 = uVar8;
      }
      unaff_R13 = unaff_R13 & 0xffffffff;
      if (bVar10) {
        unaff_RBX = uVar7;
      }
      unaff_RBX = unaff_RBX & 0xffffffff;
    }
  }
  local_5c = (undefined4)unaff_R13;
  local_60 = (int)unaff_RBX;
  std::make_shared<sliding_puzzle::SlidingPuzzleState,sliding_puzzle::SlidingPuzzleState&>
            ((SlidingPuzzleState *)&rand_state);
  this_00 = (SlidingPuzzle *)&new_state;
  std::make_shared<sliding_puzzle::SlidingPuzzleState>();
  iVar9 = 0;
  while (iVar9 < soln_lower_bound) {
    iVar5 = rand();
    bVar10 = generateSuccessorForAction
                       (this_00,&rand_state,&local_60,(&DAT_00109762)[iVar5 % 4],
                        new_state.
                        super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr);
    if (bVar10) {
      pvVar4 = ((new_state.
                 super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->state_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (uVar7 = 0;
          uVar7 != ((long)((new_state.
                            super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->state_).
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18;
          uVar7 = uVar7 + 1) {
        lVar2 = *(long *)&pvVar4[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl;
        for (uVar8 = 0;
            (long)*(pointer *)
                   ((long)&pvVar4[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
            - lVar2 >> 2 != uVar8; uVar8 = uVar8 + 1) {
          bVar10 = *(int *)(lVar2 + uVar8 * 4) == puzzle_anchor;
          if (bVar10) {
            unaff_R13 = uVar8;
          }
          unaff_R13 = unaff_R13 & 0xffffffff;
          if (bVar10) {
            unaff_RBX = uVar7;
          }
          unaff_RBX = unaff_RBX & 0xffffffff;
        }
      }
      local_5c = (undefined4)unaff_R13;
      local_60 = (int)unaff_RBX;
      this_00 = (SlidingPuzzle *)
                rand_state.
                super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator=(&(rand_state.
                    super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->state_,
                  &(new_state.
                    super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->state_);
      iVar9 = iVar9 + 1;
    }
  }
  std::__shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->start_).
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>,
             &rand_state.
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>);
  poVar6 = std::operator<<((ostream *)&std::cout,"The solvable start state is: ");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = operator<<((ostream *)&std::cout,
                      (this->start_).
                      super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rand_state.
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  _Unwind_Resume(poVar6);
}

Assistant:

bool SlidingPuzzle::generateSolvableStartState(int soln_lower_bound)
{
  int anchor_location[2];

  for (int j=0; j<goal_->state_.size(); ++j)
  {
    for (int k=0; k<goal_->state_[j].size(); ++k)
    {
      if (goal_->state_[j][k] == puzzle_anchor)
      {
        anchor_location[0] = j;
        anchor_location[1] = k;
      }
    }
  }

  SlidingPuzzleStatePtr rand_state = std::make_shared<SlidingPuzzleState>(*goal_);
  SlidingPuzzleStatePtr new_state = std::make_shared<SlidingPuzzleState>();

  for (int i=0; i<soln_lower_bound;)
  {
    char successor_action[] = {'N', 'E', 'W', 'S'};
    int rand_ind = rand() % static_cast<int>(4);


    if (generateSuccessorForAction(rand_state,
                                   anchor_location,
                                   successor_action[rand_ind],
                                   *new_state))
    {
      for (int j=0; j<new_state->state_.size(); ++j)
      {
        for (int k=0; k<new_state->state_[j].size(); ++k)
        {
          if (new_state->state_[j][k] == puzzle_anchor)
          {
            anchor_location[0] = j;
            anchor_location[1] = k;
          }
        }
      }

      *rand_state = *new_state;
      ++i;
    }
  }

  start_ = rand_state;

  std::cout << "The solvable start state is: " << std::endl;
  std::cout << *start_ << std::endl;

}